

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

xcb_generic_iterator_t xcb_input_valuator_state_end(xcb_input_valuator_state_iterator_t i)

{
  xcb_input_valuator_state_t *pxVar1;
  int iVar2;
  ulong uVar3;
  xcb_input_valuator_state_t *R;
  ulong uVar4;
  xcb_input_valuator_state_t *pxVar5;
  xcb_generic_iterator_t xVar6;
  
  uVar4 = i._8_8_;
  pxVar5 = i.data;
  if (i.rem < 1) {
    uVar3 = uVar4 >> 0x20;
  }
  else {
    iVar2 = i.rem + 1;
    do {
      pxVar1 = pxVar5;
      pxVar5 = pxVar1 + (ulong)pxVar1->num_valuators + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
    uVar3 = (long)pxVar5 - (long)pxVar1;
    uVar4 = 0;
  }
  xVar6._8_8_ = uVar4 & 0xffffffff | uVar3 << 0x20;
  xVar6.data = pxVar5;
  return xVar6;
}

Assistant:

xcb_generic_iterator_t
xcb_input_valuator_state_end (xcb_input_valuator_state_iterator_t i)
{
    xcb_generic_iterator_t ret;
    while(i.rem > 0)
        xcb_input_valuator_state_next(&i);
    ret.data = i.data;
    ret.rem = i.rem;
    ret.index = i.index;
    return ret;
}